

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O3

vector<char,_std::allocator<char>_> *
cnpy::operator+=(vector<char,_std::allocator<char>_> *lhs,unsigned_short rhs)

{
  pointer *ppcVar1;
  iterator __position;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  char val;
  char local_24;
  char local_23;
  char local_22 [2];
  
  pcVar3 = local_22;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    __position._M_current =
         (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                ((vector<char,std::allocator<char>> *)lhs,__position,&local_24);
    }
    else {
      *__position._M_current = *pcVar3;
      ppcVar1 = &(lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    pcVar3 = &local_23;
    bVar2 = false;
  } while (bVar4);
  return lhs;
}

Assistant:

std::vector<char>& operator+=(std::vector<char>& lhs, const T rhs) {
        //write in little endian
        for(size_t byte = 0; byte < sizeof(T); byte++) {
            char val = *((char*)&rhs+byte); 
            lhs.push_back(val);
        }
        return lhs;
    }